

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-default-aes-impl.c
# Opt level: O0

int ndn_lite_default_aes_cbc_decrypt
              (uint8_t *input_value,uint32_t input_size,uint8_t *output_value,uint32_t *output_size,
              uint8_t *aes_iv,abstract_aes_key *aes_key)

{
  long lVar1;
  uint8_t *iv;
  int iVar2;
  uint outlen;
  uint32_t uVar3;
  uint8_t *in;
  undefined8 uStack_120;
  ulong local_118;
  uint8_t *local_110;
  undefined1 auStack_108 [8];
  undefined1 local_100 [8];
  tc_aes_key_sched_struct schedule;
  unsigned_long __vla_expr0;
  abstract_aes_key *aes_key_local;
  uint8_t *aes_iv_local;
  uint32_t *output_size_local;
  uint8_t *output_value_local;
  uint32_t input_size_local;
  uint8_t *input_value_local;
  
  if (aes_key->key_size < 0x10) {
    input_value_local._4_4_ = -0x1b;
  }
  else {
    local_118 = (ulong)(input_size + 0x10);
    lVar1 = -(local_118 + 0xf & 0xfffffffffffffff0);
    local_110 = (uint8_t *)((long)&local_118 + lVar1);
    schedule.words._168_8_ = local_118;
    *(undefined8 *)local_110 = *(undefined8 *)aes_iv;
    *(undefined8 *)(auStack_108 + lVar1 + -8) = *(undefined8 *)(aes_iv + 8);
    *(undefined8 *)((long)&uStack_120 + lVar1) = 0x10470f;
    memcpy(auStack_108 + lVar1,input_value,(ulong)input_size);
    *(undefined8 *)((long)&uStack_120 + lVar1) = 0x10471f;
    iVar2 = tc_aes128_set_decrypt_key((TCAesKeySched_t)local_100,aes_key->key_value);
    iv = local_110;
    if (iVar2 == 1) {
      outlen = (uint)local_118;
      in = local_110 + 0x10;
      *(undefined8 *)((long)&uStack_120 + lVar1) = 0x104760;
      iVar2 = tc_cbc_mode_decrypt(output_value,outlen,in,outlen,iv,(TCAesKeySched_t)local_100);
      if (iVar2 == 1) {
        *(undefined8 *)((long)&uStack_120 + lVar1) = 0x104784;
        uVar3 = ndn_lite_default_aes_parse_unpadding_size(output_value,input_size);
        *output_size = uVar3;
        input_value_local._4_4_ = 0;
      }
      else {
        input_value_local._4_4_ = -0x19;
      }
    }
    else {
      input_value_local._4_4_ = -0x1c;
    }
  }
  return input_value_local._4_4_;
}

Assistant:

int
ndn_lite_default_aes_cbc_decrypt(const uint8_t* input_value, uint32_t input_size,
                                 uint8_t* output_value, uint32_t* output_size,
                                 const uint8_t* aes_iv, const struct abstract_aes_key* aes_key)
{
  if (aes_key->key_size < NDN_SEC_AES_MIN_KEY_SIZE) {
    return NDN_SEC_WRONG_AES_SIZE;
  }
  uint8_t final_input[TC_AES_BLOCK_SIZE + input_size];
  memcpy(final_input, aes_iv, TC_AES_BLOCK_SIZE);
  memcpy(final_input + TC_AES_BLOCK_SIZE, input_value, input_size);
  struct tc_aes_key_sched_struct schedule;
  if (tc_aes128_set_decrypt_key(&schedule, aes_key->key_value) != TC_CRYPTO_SUCCESS) {
    return NDN_SEC_INIT_FAILURE;
  }
  // Tinycrypt requires: in == iv + ciphertext, i.e. the iv and the ciphertext are contiguous.
  if (tc_cbc_mode_decrypt(output_value, sizeof(final_input), // output_value, input_size, //
                          final_input + TC_AES_BLOCK_SIZE, sizeof(final_input), //input_value, input_size, 
                          final_input, &schedule) != TC_CRYPTO_SUCCESS) {
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  }
  *output_size = ndn_lite_default_aes_parse_unpadding_size(output_value, input_size);
  return NDN_SUCCESS;
}